

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

float Abc_NtkGetArea(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  float local_1c;
  
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    pvVar2 = Abc_FrameReadLibLut();
    local_1c = 0.0;
    if (pvVar2 != (void *)0x0) {
      iVar4 = *(int *)((long)pvVar2 + 8);
      iVar1 = Abc_NtkGetFaninMax(pNtk);
      if (iVar1 <= iVar4) {
        local_1c = 0.0;
        for (iVar4 = 0; iVar4 < pNtk->vObjs->nSize; iVar4 = iVar4 + 1) {
          pAVar3 = Abc_NtkObj(pNtk,iVar4);
          if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
            local_1c = local_1c +
                       *(float *)((long)pvVar2 + (long)(pAVar3->vFanins).nSize * 4 + 0x10);
          }
        }
      }
    }
    return local_1c;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcPrint.c"
                ,0xd8,"float Abc_NtkGetArea(Abc_Ntk_t *)");
}

Assistant:

float Abc_NtkGetArea( Abc_Ntk_t * pNtk )
{
    If_LibLut_t * pLutLib;
    Abc_Obj_t * pObj;
    float Counter = 0.0;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    // get the library
    pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
    if ( pLutLib && pLutLib->LutMax >= Abc_NtkGetFaninMax(pNtk) )
    {
        Abc_NtkForEachNode( pNtk, pObj, i )
            Counter += pLutLib->pLutAreas[Abc_ObjFaninNum(pObj)];
    }
    return Counter;
}